

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXRefYs<short>,_ImPlot::GetterXRefYs<short>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXRefYs<short>,_ImPlot::GetterXRefYs<short>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  double dVar2;
  ImVec2 IVar3;
  double dVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXRefYs<short> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  int iVar17;
  ImDrawIdx IVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pIVar15 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar17 = pGVar8->Count;
  dVar2 = pGVar8->XRef;
  dVar20 = log10((double)(int)*(short *)((long)pGVar8->Ys +
                                        (long)(((pGVar8->Offset + prim) % iVar17 + iVar17) % iVar17)
                                        * (long)pGVar8->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar17 = pTVar9->YAxis;
  pIVar1 = &pIVar15->CurrentPlot->YAxis[iVar17].Range;
  dVar4 = pIVar1->Min;
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  IVar3 = pIVar15->PixelRange[iVar17].Min;
  fVar22 = (float)(pIVar15->My[iVar17] *
                   (((double)(float)(dVar20 / pIVar15->LogDenY[iVar17]) * (pIVar1->Max - dVar4) +
                    dVar4) - dVar4) + (double)IVar3.y);
  fVar23 = (float)(pIVar15->Mx * (dVar2 - (pIVar15->CurrentPlot->XAxis).Range.Min) + (double)IVar3.x
                  );
  dVar2 = pGVar8->XRef;
  dVar20 = log10((double)(int)*(short *)((long)pGVar8->Ys +
                                        (long)(((prim + pGVar8->Offset) % iVar5 + iVar5) % iVar5) *
                                        (long)pGVar8->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar17 = pTVar9->YAxis;
  pIVar10 = pIVar16->CurrentPlot;
  dVar4 = pIVar10->YAxis[iVar17].Range.Min;
  IVar3 = pIVar16->PixelRange[iVar17].Min;
  fVar19 = (float)(pIVar16->Mx * (dVar2 - (pIVar10->XAxis).Range.Min) + (double)IVar3.x);
  fVar21 = (float)(pIVar16->My[iVar17] *
                   (((double)(float)(dVar20 / pIVar16->LogDenY[iVar17]) *
                     (pIVar10->YAxis[iVar17].Range.Max - dVar4) + dVar4) - dVar4) + (double)IVar3.y)
  ;
  auVar27._0_4_ = ~-(uint)(fVar19 <= fVar23) & (uint)fVar19;
  auVar27._4_4_ = ~-(uint)(fVar21 <= fVar22) & (uint)fVar21;
  auVar27._8_4_ = ~-(uint)(fVar23 < fVar19) & (uint)fVar19;
  auVar27._12_4_ = ~-(uint)(fVar22 < fVar21) & (uint)fVar21;
  auVar13._4_4_ = (uint)fVar22 & -(uint)(fVar21 <= fVar22);
  auVar13._0_4_ = (uint)fVar23 & -(uint)(fVar19 <= fVar23);
  auVar13._8_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar19);
  auVar13._12_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar21);
  auVar27 = auVar27 | auVar13;
  fVar24 = (cull_rect->Min).y;
  auVar29._4_4_ = -(uint)(fVar24 < auVar27._4_4_);
  auVar29._0_4_ = -(uint)((cull_rect->Min).x < auVar27._0_4_);
  auVar14._4_8_ = auVar27._8_8_;
  auVar14._0_4_ = -(uint)(auVar27._4_4_ < fVar24);
  auVar28._0_8_ = auVar14._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(auVar27._8_4_ < (cull_rect->Max).x);
  auVar28._12_4_ = -(uint)(auVar27._12_4_ < (cull_rect->Max).y);
  auVar29._8_8_ = auVar28._8_8_;
  iVar17 = movmskps((int)cull_rect,auVar29);
  if (iVar17 == 0xf) {
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar24 = fVar19 - fVar23;
    fVar25 = fVar21 - fVar22;
    fVar26 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar26) {
      fVar26 = 1.0 / SQRT(fVar26);
      fVar24 = fVar24 * fVar26;
      fVar25 = fVar25 * fVar26;
    }
    fVar26 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar24 = fVar26 * fVar24;
    fVar26 = fVar26 * fVar25;
    (pIVar11->pos).x = fVar26 + fVar23;
    (pIVar11->pos).y = fVar22 - fVar24;
    (pIVar11->uv).x = IVar3.x;
    (pIVar11->uv).y = IVar3.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar26 + fVar19;
    pIVar11[1].pos.y = fVar21 - fVar24;
    pIVar11[1].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar19 - fVar26;
    pIVar11[2].pos.y = fVar21 + fVar24;
    pIVar11[2].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar23 - fVar26;
    pIVar11[3].pos.y = fVar24 + fVar22;
    pIVar11[3].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar18;
    pIVar12[1] = IVar18 + 1;
    pIVar12[2] = IVar18 + 2;
    pIVar12[3] = IVar18;
    pIVar12[4] = IVar18 + 2;
    pIVar12[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }